

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_window_expression.cpp
# Opt level: O2

idx_t duckdb::BoundWindowExpression::GetSharedOrders
                (vector<duckdb::BoundOrderByNode,_true> *lhs,
                vector<duckdb::BoundOrderByNode,_true> *rhs)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  const_reference this;
  const_reference other;
  size_type __n;
  
  uVar2 = ((long)(lhs->
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(lhs->
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar3 = ((long)(rhs->
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(rhs->
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar2 < uVar3) {
    uVar3 = uVar2;
  }
  __n = 0;
  do {
    if (uVar3 == __n) {
      return uVar3;
    }
    this = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::at
                     (&lhs->
                       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                      ,__n);
    other = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::at
                      (&rhs->
                        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       ,__n);
    bVar1 = BoundOrderByNode::Equals(this,other);
    __n = __n + 1;
  } while (bVar1);
  return 0;
}

Assistant:

idx_t BoundWindowExpression::GetSharedOrders(const vector<BoundOrderByNode> &lhs, const vector<BoundOrderByNode> &rhs) {
	const auto overlap = MinValue<idx_t>(lhs.size(), rhs.size());

	idx_t result = 0;
	for (; result < overlap; ++result) {
		if (!lhs.at(result).Equals(rhs.at(result))) {
			return 0;
		}
	}

	return result;
}